

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O2

void __thiscall adios2::format::BPBase::BPBase(BPBase *this,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  this->_vptr_BPBase = (_func_int **)&PTR__BPBase_0081be28;
  this->m_Comm = comm;
  this->m_RankMPI = 0;
  this->m_SizeMPI = 1;
  this->m_Processes = 1;
  this->m_PreMetadataFileLength = 0;
  this->m_PreDataFileLength = 0;
  BufferSTL::BufferSTL(&this->m_Data);
  BufferSTL::BufferSTL(&this->m_Metadata);
  MetadataSet::MetadataSet(&this->m_MetadataSet);
  Parameters::Parameters(&this->m_Parameters);
  this->m_IsClosed = false;
  profiling::IOChrono::IOChrono(&this->m_Profiler);
  this->m_IsRowMajor = true;
  this->m_ReverseDimensions = false;
  aggregator::MPIChain::MPIChain(&this->m_Aggregator);
  p_Var1 = &(this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_DeferredVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_DeferredVariablesDataSize = 0;
  (this->m_SerializedAttributes)._M_h._M_buckets =
       &(this->m_SerializedAttributes)._M_h._M_single_bucket;
  (this->m_SerializedAttributes)._M_h._M_bucket_count = 1;
  (this->m_SerializedAttributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_SerializedAttributes)._M_h._M_element_count = 0;
  (this->m_SerializedAttributes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_SerializedAttributes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_SerializedAttributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_ThreadBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = helper::Comm::Rank(this->m_Comm);
  this->m_RankMPI = iVar2;
  iVar2 = helper::Comm::Size(this->m_Comm);
  this->m_SizeMPI = iVar2;
  (this->m_Profiler).m_IsActive = true;
  return;
}

Assistant:

BPBase::BPBase(helper::Comm const &comm) : m_Comm(comm)
{
    m_RankMPI = m_Comm.Rank();
    m_SizeMPI = m_Comm.Size();
    m_Profiler.m_IsActive = true; // default
}